

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

void free_all_body_sequence_items(MESSAGE_HANDLE message)

{
  ulong local_18;
  size_t i;
  MESSAGE_HANDLE message_local;
  
  for (local_18 = 0; local_18 < message->body_amqp_sequence_count; local_18 = local_18 + 1) {
    if (message->body_amqp_sequence_items[local_18] != (AMQP_VALUE)0x0) {
      amqpvalue_destroy(message->body_amqp_sequence_items[local_18]);
    }
  }
  if (message->body_amqp_sequence_items != (AMQP_VALUE *)0x0) {
    free(message->body_amqp_sequence_items);
  }
  message->body_amqp_sequence_count = 0;
  message->body_amqp_sequence_items = (AMQP_VALUE *)0x0;
  return;
}

Assistant:

static void free_all_body_sequence_items(MESSAGE_HANDLE message)
{
    size_t i;

    for (i = 0; i < message->body_amqp_sequence_count; i++)
    {
        if (message->body_amqp_sequence_items[i] != NULL)
        {
            /* Codes_SRS_MESSAGE_01_137: [ Each sequence shall be freed by calling `amqpvalue_destroy`. ]*/
            amqpvalue_destroy(message->body_amqp_sequence_items[i]);
        }
    }

    if (message->body_amqp_sequence_items != NULL)
    {
        free(message->body_amqp_sequence_items);
    }
    message->body_amqp_sequence_count = 0;
    message->body_amqp_sequence_items = NULL;
}